

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_TimedText.cpp
# Opt level: O3

h__Reader * __thiscall
ASDCP::TimedText::MXFReader::h__Reader::ReadTimedTextResource
          (h__Reader *this,FrameBuffer *FrameBuf,AESDecContext *Ctx,HMACContext *HMAC)

{
  Dictionary *this_00;
  ui32_t uVar1;
  ui32_t uVar2;
  ui32_t uVar3;
  char cVar4;
  MDDEntry *Ctx_00;
  long *local_48 [2];
  long local_38 [2];
  
  cVar4 = (**(code **)(**(long **)&(FrameBuf->super_FrameBuffer).m_Capacity + 0x40))();
  if (cVar4 == '\0') {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_INIT);
  }
  else {
    this_00 = (Dictionary *)(FrameBuf->super_FrameBuffer).m_Data;
    if (this_00 == (Dictionary *)0x0) {
      __assert_fail("m_Dict",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_TimedText.cpp"
                    ,0xf0,
                    "ASDCP::Result_t ASDCP::TimedText::MXFReader::h__Reader::ReadTimedTextResource(FrameBuffer &, AESDecContext *, HMACContext *)"
                   );
    }
    Ctx_00 = Dictionary::Type(this_00,MDD_TimedTextEssence);
    h__ASDCPReader::ReadEKLVFrame
              (&this->super_h__ASDCPReader,(ui32_t)FrameBuf,(FrameBuffer *)0x0,(byte_t *)Ctx,
               (AESDecContext *)Ctx_00,HMAC);
    if (-1 < *(int *)&(this->super_h__ASDCPReader).
                      super_TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter>.
                      _vptr_TrackFileReader) {
      uVar1 = FrameBuf[0x13].super_FrameBuffer.m_Size;
      uVar2 = FrameBuf[0x13].super_FrameBuffer.m_FrameNumber;
      uVar3 = FrameBuf[0x13].super_FrameBuffer.m_SourceLength;
      *(undefined4 *)&Ctx[5].m_Context.m_p =
           *(undefined4 *)&FrameBuf[0x13].super_FrameBuffer.m_OwnMem;
      *(ui32_t *)((long)&Ctx[5].m_Context.m_p + 4) = uVar1;
      *(ui32_t *)&Ctx[6].m_Context.m_p = uVar2;
      *(ui32_t *)((long)&Ctx[6].m_Context.m_p + 4) = uVar3;
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"text/xml","");
      std::__cxx11::string::_M_assign((string *)(Ctx + 7));
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::TimedText::MXFReader::h__Reader::ReadTimedTextResource(FrameBuffer& FrameBuf,
							      AESDecContext* Ctx, HMACContext* HMAC)
{
  if ( ! m_File->IsOpen() )
    return RESULT_INIT;

  assert(m_Dict);
  Result_t result = ReadEKLVFrame(0, FrameBuf, m_Dict->ul(MDD_TimedTextEssence), Ctx, HMAC);

 if( ASDCP_SUCCESS(result) )
   {
     FrameBuf.AssetID(m_TDesc.AssetID);
     FrameBuf.MIMEType("text/xml");
   }

 return result;
}